

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.h
# Opt level: O2

void __thiscall fmp4_stream::tfhd::tfhd(tfhd *this)

{
  allocator local_31;
  string local_30 [32];
  
  full_box::full_box(&this->super_full_box);
  (this->super_full_box).super_box._vptr_box = (_func_int **)&PTR_size_00117c90;
  *(undefined4 *)&(this->super_full_box).field_0x6c = 0;
  *(undefined4 *)&(this->super_full_box).field_0x6f = 0;
  *(undefined8 *)&this->track_id_ = 0;
  *(undefined8 *)((long)&this->base_data_offset_ + 4) = 0;
  this->sample_description_index_ = 0;
  this->default_sample_duration_ = 0;
  this->default_sample_size_ = 0;
  this->default_sample_flags_ = 0;
  std::__cxx11::string::string(local_30,"tfhd",&local_31);
  std::__cxx11::string::operator=((string *)&(this->super_full_box).super_box.box_type_,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void set_zero() 
		{
			base_data_offset_present_=false;
			sample_description_index_present_=false;
			default_sample_duration_present_=false;
			default_sample_size_present_=false;
			default_sample_flags_present_=false;
			duration_is_empty_=false;
			default_base_is_moof_=false;

			track_id_=0;
			base_data_offset_=0;
			sample_description_index_=0;
			default_sample_duration_=0;
			default_sample_size_=0;
			default_sample_flags_=0;
		}